

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

void __thiscall flow::IRHandler::~IRHandler(IRHandler *this)

{
  bool bVar1;
  element_type *this_00;
  element_type *this_01;
  pointer this_02;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *this_03;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  UVar2;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  UVar3;
  const_iterator local_98;
  _List_node_base *local_90;
  pointer local_88;
  BasicBlock *bb_1;
  iterator e;
  iterator i;
  Instr *instr;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range1;
  IRHandler *this_local;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__IRHandler_002caf10;
  UVar2 = basicBlocks_abi_cxx11_(this);
  __begin1 = UVar2.begin_.it_._M_node;
  __end1 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin1);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin1);
  while (bVar1 = util::
                 UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                 ::iterator::operator!=(&__end1,(iterator *)&bb), bVar1) {
    this_00 = util::
              UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              ::iterator::operator*(&__end1);
    UVar3 = BasicBlock::instructions(this_00);
    __begin2 = UVar3.begin_.it_._M_current;
    __end2 = util::
             UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                      *)&__begin2);
    instr = (Instr *)util::
                     UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                     ::end((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                            *)&__begin2);
    while (bVar1 = util::
                   UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                   ::iterator::operator!=(&__end2,(iterator *)&instr), bVar1) {
      this_01 = util::
                UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                ::iterator::operator*(&__end2);
      Instr::clearOperands(this_01);
      util::
      UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
      ::iterator::operator++(&__end2);
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end1);
  }
  while (bVar1 = std::__cxx11::
                 list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                 ::empty(&this->blocks_), ((bVar1 ^ 0xffU) & 1) != 0) {
    e = std::__cxx11::
        list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
        ::begin(&this->blocks_);
    bb_1 = (BasicBlock *)
           std::__cxx11::
           list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ::end(&this->blocks_);
    while (bVar1 = std::operator!=(&e,(_Self *)&bb_1), bVar1) {
      this_02 = std::
                _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                ::operator->(&e);
      local_88 = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::get
                           (this_02);
      this_03 = BasicBlock::predecessors(local_88);
      bVar1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::empty(this_03);
      if (bVar1) {
        std::
        _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
        ::_List_const_iterator(&local_98,&e);
        local_90 = (_List_node_base *)
                   std::__cxx11::
                   list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                   ::erase(&this->blocks_,local_98);
        e = (iterator)local_90;
      }
      else {
        std::
        _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>::
        operator++(&e);
      }
    }
  }
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::~list(&this->blocks_);
  Constant::~Constant(&this->super_Constant);
  return;
}

Assistant:

IRHandler::~IRHandler() {
  for (BasicBlock* bb : basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      instr->clearOperands();
    }
  }

  while (!blocks_.empty()) {
    auto i = blocks_.begin();
    auto e = blocks_.end();

    while (i != e) {
      BasicBlock* bb = i->get();

      if (bb->predecessors().empty()) {
        i = blocks_.erase(i);
      } else {
        // skip BBs that other BBs still point to (we never point to ourself).
        ++i;
      }
    }
  }
}